

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrate_baseline.cpp
# Opt level: O3

void parse_arg(int argc,char **argv,double *h,int *cpus)

{
  int iVar1;
  uint *puVar2;
  char *pcVar3;
  int *piVar4;
  ulong uVar5;
  runtime_error *this;
  double dVar6;
  allocator local_61;
  uint *local_60;
  char *local_58 [2];
  char local_48 [16];
  char *local_38;
  
  if (argc < 3) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"Incorrect input");
    goto LAB_0010250d;
  }
  local_60 = (uint *)cpus;
  std::__cxx11::string::string((string *)local_58,argv[1],&local_61);
  pcVar3 = local_58[0];
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  *piVar4 = 0;
  dVar6 = strtod(pcVar3,&local_38);
  if (local_38 == pcVar3) {
    std::__throw_invalid_argument("stod");
LAB_001024d9:
    std::__throw_invalid_argument("stoi");
LAB_001024e5:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (*piVar4 == 0) {
LAB_00102418:
      *piVar4 = iVar1;
    }
    else if (*piVar4 == 0x22) {
      dVar6 = (double)std::__throw_out_of_range("stod");
      goto LAB_00102418;
    }
    *h = dVar6;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
    }
    std::__cxx11::string::string((string *)local_58,argv[2],&local_61);
    pcVar3 = local_58[0];
    iVar1 = *piVar4;
    *piVar4 = 0;
    uVar5 = strtol(local_58[0],&local_38,10);
    puVar2 = local_60;
    if (local_38 == pcVar3) goto LAB_001024d9;
    if (((long)(int)(uint)uVar5 != uVar5) || (*piVar4 == 0x22)) goto LAB_001024e5;
    if (*piVar4 == 0) {
      *piVar4 = iVar1;
    }
    *local_60 = (uint)uVar5;
    if (local_58[0] != local_48) {
      operator_delete(local_58[0]);
      uVar5 = (ulong)*puVar2;
    }
    if (0 < (int)uVar5) {
      return;
    }
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Cant ran in less than 1 thread");
LAB_0010250d:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void parse_arg(int argc, char *argv[], double &h, int &cpus){
  if(argc  < 3)
    throw std::runtime_error("Incorrect input");
  try{
    h = std::stod(argv[1]);
    cpus = std::stoi(argv[2]);
  }catch(...){
    throw std::runtime_error("Parsing failed");
  }
  if (cpus < 1){
    throw std::runtime_error("Cant ran in less than 1 thread");
  }
}